

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageinput.cc
# Opt level: O0

int ImageInput::open(char *__file,int __oflag,...)

{
  string *psVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  pointer ppVar7;
  stringstream *this;
  type pbVar8;
  streambuf *psVar9;
  pointer pbVar10;
  pointer pIVar11;
  runtime_error *prVar12;
  size_t sVar13;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ImageSpec tmpspec_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>
  *plugin;
  iterator __end1;
  iterator __begin1;
  InputPluginMap *__range1;
  runtime_error *e;
  ImageSpec tmpspec;
  string specificError;
  vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_> formatsTried;
  const_iterator found;
  string format;
  bool doBuffer;
  string sn;
  string *fn;
  Creator createFunction;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buffer;
  ifstream ifs;
  unique_ptr<ImageInput,_std::default_delete<ImageInput>_> *in;
  pointer in_stack_fffffffffffff748;
  ImageInput *in_stack_fffffffffffff750;
  path *in_stack_fffffffffffff758;
  __normal_iterator<ImageInput_*(**)(),_std::vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>_>
  in_stack_fffffffffffff760;
  __normal_iterator<ImageInput_*(**)(),_std::vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>_>
  in_stack_fffffffffffff768;
  undefined8 in_stack_fffffffffffff770;
  format fVar15;
  size_t *psVar14;
  string_type *in_stack_fffffffffffff778;
  path *in_stack_fffffffffffff780;
  char *in_stack_fffffffffffff788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff790;
  string local_790 [32];
  char *local_770;
  size_t local_768;
  string local_760 [32];
  undefined1 local_740 [168];
  _func_ImageInput_ptr **local_698;
  _func_ImageInput_ptr **local_690;
  _func_ImageInput_ptr **local_688;
  _func_ImageInput_ptr **local_680;
  reference local_678;
  _Self local_670;
  _Self local_668;
  undefined1 *local_660;
  undefined4 local_64c;
  format_args in_stack_fffffffffffff9b8;
  string_view in_stack_fffffffffffff9c8;
  string local_598 [64];
  undefined8 local_558;
  undefined8 local_550;
  iterator local_548;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>
  local_540;
  iterator local_538;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>
  local_530;
  string local_528;
  string local_508 [32];
  undefined1 local_4e8 [39];
  undefined1 local_4c1;
  char *local_4c0;
  char *local_4b8;
  size_t local_4b0;
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [75];
  byte local_41d;
  allocator<char> local_409;
  string local_408 [32];
  string *local_3e8;
  _func_ImageInput_ptr *local_3e0;
  undefined1 local_3d8 [8];
  undefined1 local_3d0 [520];
  undefined8 local_1c8;
  undefined8 local_1c0;
  string *local_1b8;
  char *local_1b0;
  undefined1 local_1a8 [40];
  undefined8 local_180;
  undefined1 *local_178;
  char *local_170;
  size_t local_168;
  char **local_160;
  string *local_158;
  char *local_150;
  size_t sStack_148;
  string *local_140;
  char *local_138;
  char **local_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_128 [3];
  undefined8 local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_108;
  char *local_100;
  string *local_f0;
  char *local_e8;
  size_t sStack_e0;
  string *local_d8;
  char *local_d0;
  char **local_c8;
  char **local_c0;
  char *local_b8;
  size_t sStack_b0;
  undefined1 *local_a8;
  undefined8 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined8 *local_80;
  char *local_78;
  char **local_70;
  char *local_68;
  char **local_60;
  char *local_58;
  char **local_50;
  char *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_28;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_10;
  char *local_8;
  
  fVar15 = (format)((ulong)in_stack_fffffffffffff770 >> 0x38);
  local_1c8 = in_RCX;
  local_1c0 = in_RDX;
  local_1b8 = ___oflag;
  local_1b0 = __file;
  bVar2 = Imageio::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                   *)0x2ef4de);
  if (bVar2) {
    Imageio::catalogBuiltinPlugins();
    bVar2 = Imageio::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
            ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                     *)0x2ef4f5);
    if (bVar2) {
      __assert_fail("!Imageio::inputFormats.empty() && \"No image input plugins compiled in.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/imageinput.cc"
                    ,0x25,
                    "static std::unique_ptr<ImageInput> ImageInput::open(const std::string &, const ImageSpec *, WarningCallbackFunction)"
                   );
    }
  }
  std::ifstream::ifstream(local_3d0);
  std::unique_ptr<std::__cxx11::stringstream,std::default_delete<std::__cxx11::stringstream>>::
  unique_ptr<std::default_delete<std::__cxx11::stringstream>,void>
            ((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff750);
  local_3e0 = (_func_ImageInput_ptr *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff790,in_stack_fffffffffffff788,
             (allocator<char> *)in_stack_fffffffffffff780);
  std::allocator<char>::~allocator(&local_409);
  local_41d = 1;
  iVar4 = std::__cxx11::string::compare((char *)local_1b8);
  if (iVar4 == 0) {
    std::fpos<__mbstate_t>::fpos
              ((fpos<__mbstate_t> *)in_stack_fffffffffffff750,(streamoff)in_stack_fffffffffffff748);
    std::istream::seekg(&std::cin,local_558,local_550);
    local_41d = std::ios::fail();
    local_41d = local_41d & 1;
    if (local_41d != 0) {
      this = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(this);
      std::unique_ptr<std::__cxx11::stringstream,std::default_delete<std::__cxx11::stringstream>>::
      unique_ptr<std::default_delete<std::__cxx11::stringstream>,void>
                ((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff750,(pointer)in_stack_fffffffffffff748);
      Imageio::std::
      unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff750,
                  (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff748);
      Imageio::std::
      unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff750);
      pbVar8 = Imageio::std::
               unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffff750);
      psVar9 = (streambuf *)std::ios::rdbuf();
      std::ostream::operator<<(pbVar8 + 0x10,psVar9);
      pbVar10 = Imageio::std::
                unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator->((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)0x2efd1e);
      std::istream::seekg((long)pbVar10,_S_beg);
    }
    local_3e8 = local_408;
  }
  else {
    std::__cxx11::string::string(local_488,local_1b8);
    DecodeUTF8Path((string *)in_stack_fffffffffffff748);
    std::filesystem::__cxx11::path::path(in_stack_fffffffffffff780,in_stack_fffffffffffff778,fVar15)
    ;
    std::operator|(_S_bin,_S_in);
    Imageio::std::basic_ifstream<char,_std::char_traits<char>_>::
    open<std::filesystem::__cxx11::path>
              ((basic_ifstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff760._M_current
               ,in_stack_fffffffffffff758,(openmode)((ulong)in_stack_fffffffffffff750 >> 0x20));
    std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffff750);
    std::__cxx11::string::~string(local_468);
    std::__cxx11::string::~string(local_488);
    bVar3 = std::ios::fail();
    psVar1 = local_1b8;
    if ((bVar3 & 1) != 0) {
      local_4c1 = 1;
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_130 = &local_4b8;
      local_138 = "Open of \"{}\" failed. {}";
      local_68 = "Open of \"{}\" failed. {}";
      local_4b8 = "Open of \"{}\" failed. {}";
      local_60 = local_130;
      local_4b0 = std::char_traits<char>::length((char_type *)0x2ef729);
      psVar1 = local_1b8;
      local_58 = local_138;
      piVar5 = __errno_location();
      local_4c0 = strerror(*piVar5);
      local_140 = local_4a8;
      local_150 = local_4b8;
      sStack_148 = local_4b0;
      local_158 = psVar1;
      local_160 = &local_4c0;
      local_c0 = &local_150;
      local_170 = local_4b8;
      local_168 = local_4b0;
      local_b8 = local_170;
      sStack_b0 = local_168;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const,char*>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff768._M_current,(char **)in_stack_fffffffffffff760._M_current)
      ;
      local_a0 = &local_180;
      local_a8 = local_1a8;
      local_88 = 0xcd;
      local_180 = 0xcd;
      local_98 = local_a8;
      local_90 = local_a8;
      local_80 = local_a0;
      local_178 = local_a8;
      ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9b8);
      std::runtime_error::runtime_error(prVar12,local_4a8);
      local_4c1 = 0;
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::find_last_of((char)local_1b8,0x2e);
    std::__cxx11::string::substr((ulong)local_508,(ulong)psVar1);
    Imageio::string::string((string *)in_stack_fffffffffffff750,(string *)in_stack_fffffffffffff748)
    ;
    std::__cxx11::string::~string(local_508);
    Imageio::string::tolower(&local_528,(int)local_4e8);
    Imageio::string::~string((string *)0x2efab0);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      local_538._M_node =
           (_Base_ptr)
           Imageio::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                   *)in_stack_fffffffffffff748,(key_type *)0x2efad9);
      Imageio::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>
      ::_Rb_tree_const_iterator(&local_530,&local_538);
      local_548._M_node =
           (_Base_ptr)
           Imageio::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                  *)in_stack_fffffffffffff748);
      Imageio::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>
      ::_Rb_tree_const_iterator(&local_540,&local_548);
      bVar2 = Imageio::std::operator!=(&local_530,&local_540);
      if (bVar2) {
        ppVar7 = Imageio::std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>
                               *)0x2efb59);
        local_3e0 = ppVar7->second;
      }
    }
    local_3e8 = local_1b8;
    Imageio::string::~string((string *)0x2efbd2);
  }
  Imageio::std::vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>::vector
            ((vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_> *)0x2efd76);
  std::__cxx11::string::string(local_598);
  std::unique_ptr<ImageInput,std::default_delete<ImageInput>>::
  unique_ptr<std::default_delete<ImageInput>,void>
            ((unique_ptr<ImageInput,_std::default_delete<ImageInput>_> *)in_stack_fffffffffffff750);
  if (local_3e0 == (_func_ImageInput_ptr *)0x0) {
    local_660 = Imageio::inputFormats_abi_cxx11_;
    local_668._M_node =
         (_Base_ptr)
         Imageio::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                  *)in_stack_fffffffffffff748);
    local_670._M_node =
         (_Base_ptr)
         Imageio::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                *)in_stack_fffffffffffff748);
    while( true ) {
      bVar2 = Imageio::std::operator!=(&local_668,&local_670);
      if (!bVar2) {
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) != 0) {
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_c8 = &local_770;
          local_d0 = 
          "No image plugin recognized the format of \"{}\". Is it a file format that we don\'t know about?\n"
          ;
          local_78 = 
          "No image plugin recognized the format of \"{}\". Is it a file format that we don\'t know about?\n"
          ;
          local_770 = 
          "No image plugin recognized the format of \"{}\". Is it a file format that we don\'t know about?\n"
          ;
          psVar14 = &local_768;
          local_70 = local_c8;
          sVar13 = std::char_traits<char>::length((char_type *)0x2f0394);
          *psVar14 = sVar13;
          local_8 = local_d0;
          iVar4 = std::__cxx11::string::compare((char *)local_1b8);
          if (iVar4 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff790,in_stack_fffffffffffff788,
                       (allocator<char> *)in_stack_fffffffffffff780);
          }
          else {
            std::__cxx11::string::string(local_790,local_1b8);
          }
          local_d8 = local_760;
          local_e8 = local_770;
          sStack_e0 = local_768;
          local_f0 = local_790;
          local_50 = &local_e8;
          local_100 = local_770;
          local_48 = local_100;
          local_128[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff758);
          local_30 = &local_110;
          local_38 = local_128;
          local_20 = 0xd;
          local_110 = 0xd;
          local_28 = local_38;
          local_18 = local_30;
          local_10 = local_38;
          local_108 = local_38;
          ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9b8);
          std::runtime_error::runtime_error(prVar12,local_760);
          __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar12,local_598);
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_678 = Imageio::std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>
                               *)in_stack_fffffffffffff750);
      local_688 = (_func_ImageInput_ptr **)
                  Imageio::std::vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>::begin
                            ((vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_> *)
                             in_stack_fffffffffffff748);
      local_690 = (_func_ImageInput_ptr **)
                  Imageio::std::vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>::end
                            ((vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_> *)
                             in_stack_fffffffffffff748);
      local_680 = (_func_ImageInput_ptr **)
                  std::
                  find<__gnu_cxx::__normal_iterator<ImageInput*(**)(),std::vector<ImageInput*(*)(),std::allocator<ImageInput*(*)()>>>,ImageInput*(*)()>
                            (in_stack_fffffffffffff768,in_stack_fffffffffffff760,
                             (_func_ImageInput_ptr **)in_stack_fffffffffffff758);
      local_698 = (_func_ImageInput_ptr **)
                  Imageio::std::vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>::end
                            ((vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_> *)
                             in_stack_fffffffffffff748);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<ImageInput_*(**)(),_std::vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>_>
                          *)in_stack_fffffffffffff750,
                         (__normal_iterator<ImageInput_*(**)(),_std::vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>_>
                          *)in_stack_fffffffffffff748);
      if (!bVar2) break;
      Imageio::std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>
                    *)in_stack_fffffffffffff750);
    }
    Imageio::std::vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>::push_back
              ((vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_> *)
               in_stack_fffffffffffff760._M_current,(value_type *)in_stack_fffffffffffff758);
    local_3e0 = local_678->second;
    (*local_3e0)();
    std::unique_ptr<ImageInput,std::default_delete<ImageInput>>::
    unique_ptr<std::default_delete<ImageInput>,void>
              ((unique_ptr<ImageInput,_std::default_delete<ImageInput>_> *)in_stack_fffffffffffff750
               ,in_stack_fffffffffffff748);
    Imageio::std::unique_ptr<ImageInput,_std::default_delete<ImageInput>_>::operator=
              ((unique_ptr<ImageInput,_std::default_delete<ImageInput>_> *)in_stack_fffffffffffff750
               ,(unique_ptr<ImageInput,_std::default_delete<ImageInput>_> *)
                in_stack_fffffffffffff748);
    std::unique_ptr<ImageInput,_std::default_delete<ImageInput>_>::~unique_ptr
              ((unique_ptr<ImageInput,_std::default_delete<ImageInput>_> *)
               in_stack_fffffffffffff760._M_current);
    std::unique_ptr<ImageInput,_std::default_delete<ImageInput>_>::operator->
              ((unique_ptr<ImageInput,_std::default_delete<ImageInput>_> *)0x2f0147);
    Imageio::std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)in_stack_fffffffffffff760._M_current,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)in_stack_fffffffffffff758);
    connectCallback(in_stack_fffffffffffff750,(WarningCallbackFunction *)in_stack_fffffffffffff748);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)0x2f0184);
    ImageSpec::ImageSpec((ImageSpec *)in_stack_fffffffffffff760._M_current);
    pIVar11 = std::unique_ptr<ImageInput,_std::default_delete<ImageInput>_>::operator->
                        ((unique_ptr<ImageInput,_std::default_delete<ImageInput>_> *)0x2f01a0);
    open(pIVar11,(char *)local_3e8,(int)local_3d0,local_3d8,local_740);
    local_64c = 1;
    ImageSpec::~ImageSpec((ImageSpec *)0x2f01ea);
  }
  else {
    Imageio::std::vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>::push_back
              ((vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_> *)
               in_stack_fffffffffffff760._M_current,(value_type *)in_stack_fffffffffffff758);
    (*local_3e0)();
    std::unique_ptr<ImageInput,std::default_delete<ImageInput>>::
    unique_ptr<std::default_delete<ImageInput>,void>
              ((unique_ptr<ImageInput,_std::default_delete<ImageInput>_> *)in_stack_fffffffffffff750
               ,in_stack_fffffffffffff748);
    Imageio::std::unique_ptr<ImageInput,_std::default_delete<ImageInput>_>::operator=
              ((unique_ptr<ImageInput,_std::default_delete<ImageInput>_> *)in_stack_fffffffffffff750
               ,(unique_ptr<ImageInput,_std::default_delete<ImageInput>_> *)
                in_stack_fffffffffffff748);
    std::unique_ptr<ImageInput,_std::default_delete<ImageInput>_>::~unique_ptr
              ((unique_ptr<ImageInput,_std::default_delete<ImageInput>_> *)
               in_stack_fffffffffffff760._M_current);
    std::unique_ptr<ImageInput,_std::default_delete<ImageInput>_>::operator->
              ((unique_ptr<ImageInput,_std::default_delete<ImageInput>_> *)0x2efe0f);
    Imageio::std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)in_stack_fffffffffffff760._M_current,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)in_stack_fffffffffffff758);
    connectCallback(in_stack_fffffffffffff750,(WarningCallbackFunction *)in_stack_fffffffffffff748);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)0x2efe4c);
    ImageSpec::ImageSpec((ImageSpec *)in_stack_fffffffffffff760._M_current);
    pIVar11 = std::unique_ptr<ImageInput,_std::default_delete<ImageInput>_>::operator->
                        ((unique_ptr<ImageInput,_std::default_delete<ImageInput>_> *)0x2efe68);
    open(pIVar11,(char *)local_3e8,(int)local_3d0,local_3d8,&stack0xfffffffffffff9b8);
    local_64c = 1;
    ImageSpec::~ImageSpec((ImageSpec *)0x2efeb2);
  }
  std::__cxx11::string::~string(local_598);
  Imageio::std::vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>::~vector
            ((vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_> *)
             in_stack_fffffffffffff760._M_current);
  std::__cxx11::string::~string(local_408);
  Imageio::std::
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750);
  std::ifstream::~ifstream(local_3d0);
  return (int)__file;
}

Assistant:

std::unique_ptr<ImageInput>
ImageInput::open(const std::string& filename,
                 const ImageSpec* /*config*/,
                 WarningCallbackFunction wcb)
                 //Filesystem::IOProxy* ioproxy, string_view plugin_searchpath)
{
    // Populate inputFormats.
    if (Imageio::inputFormats.empty()) {
        Imageio::catalogBuiltinPlugins();
        assert(!Imageio::inputFormats.empty() && "No image input plugins compiled in.");
    }

    std::ifstream ifs;
    std::unique_ptr<std::stringstream> buffer;
    ImageInput::Creator createFunction = nullptr;
    const std::string* fn;
    const std::string sn("stdin");
    bool doBuffer = true;

    if (filename.compare("-")) {
        // Regular file.
        // Check file exists, before looking for a suitable plugin.
        // MS's STL has `open` overloads that accept wchar_t to handle
        // Window's Unicode file names.
        ifs.open(std::filesystem::path(DecodeUTF8Path(filename)), std::ios::binary | std::ios::in);
        if (ifs.fail()) {
            throw std::runtime_error(
                fmt::format("Open of \"{}\" failed. {}",
                            filename, strerror(errno))
            );
        }

        // Extract the file extension from the filename (without the leading dot)
        Imageio::string format = filename.substr(filename.find_last_of('.')+1);
        format.tolower();

        // Look for a plugin for that extension.
        if (!format.empty()) {
            // First try the plug-in that matches the extension
            Imageio::InputPluginMap::const_iterator found
                       = Imageio::inputFormats.find(format);
            if (found != Imageio::inputFormats.end()) {
                createFunction = found->second;
            }
        }
        fn = &filename;
    } else {
        // cin (stdin)
#if defined(_WIN32)
        // Set "stdin" to have binary mode. There is no way to this via cin.
        (void)_setmode( _fileno( stdin ), _O_BINARY );
        // Windows shells set the FILE_SYNCHRONOUS_IO_NONALERT option when
        // creating pipes. Cygwin since 3.4.x does the same thing, a change
        // which affects anything dependent on it, e.g. Git for Windows
        // (since 2.41.0) and MSYS2. When this option is set, cin.seekg(0)
        // erroneously returns success. Always buffer.
        doBuffer = true;
#else
        // Can we seek in this cin?
        std::cin.seekg(0);
        doBuffer = std::cin.fail();
#endif
        if (doBuffer) {
            // Can't seek. Buffer stdin. This is a potentially large buffer.
            // Must avoid copy. If use stack variable for ss, it's streambuf
            // will also be on the stack and lost after this function exits
            // even with std::move.
            buffer =
                std::unique_ptr<std::stringstream>(new std::stringstream);
            *buffer << std::cin.rdbuf();
            buffer->seekg(0, std::ios::beg);
        }
        fn = &sn;
    }

    // Remember which formats we've already tried, so we don't double dip.
    std::vector<ImageInput::Creator> formatsTried;
    std::string specificError;
    std::unique_ptr<ImageInput> in;

    if (createFunction) {
        formatsTried.push_back(createFunction);
        // Try our guess.
        try {
            in = std::unique_ptr<ImageInput>(createFunction());
            in->connectCallback(wcb);
            ImageSpec tmpspec;
            in->open(*fn, ifs, buffer, tmpspec);
            return in;
        } catch (const std::runtime_error& e) {
            // Oops, it failed.  Apparently, this file can't be
            // opened with this II.
            if (in) {
                specificError = e.what();
                in.reset();
            }
        }
    }

    // A plugin designated for the requested extension either couldn't be
    // found or was unable to open the file or there is no requested extension
    // due to stdin. Try every plugin and see if one will open the file.
    for (auto&& plugin : Imageio::inputFormats) {
        // If we already tried this create function, don't do it again
        if (std::find(formatsTried.begin(), formatsTried.end(), plugin.second)
            != formatsTried.end()) {
            continue;
        }
        formatsTried.push_back(plugin.second);  // remember
        createFunction = plugin.second;
        try {
            in = std::unique_ptr<ImageInput>(createFunction());
            in->connectCallback(wcb);
            ImageSpec tmpspec;
            in->open(*fn, ifs, buffer, tmpspec);
            return in;
        } catch (...) {
            if (in.get()) in.reset();
            continue;
        }
    }

    if (!specificError.empty()) {
        // Pass along any specific error message we got from our
        // best guess of the format.
        throw std::runtime_error(specificError);
    } else {
        throw std::runtime_error(
            fmt::format(
                "No image plugin recognized the format of \"{}\". "
                "Is it a file format that we don't know about?\n",
                filename.compare("-") ? filename : "the data on stdin")
            );
    }
}